

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void * uhash_removeElement_63(UHashtable *hash,UHashElement *e)

{
  UHashElement *nce;
  UHashElement *e_local;
  UHashtable *hash_local;
  
  if (e->hashcode < 0) {
    hash_local = (UHashtable *)0x0;
  }
  else {
    hash_local = (UHashtable *)_uhash_internalRemoveElement(hash,e);
  }
  return hash_local;
}

Assistant:

U_CAPI void* U_EXPORT2
uhash_removeElement(UHashtable *hash, const UHashElement* e) {
    U_ASSERT(hash != NULL);
    U_ASSERT(e != NULL);
    if (!IS_EMPTY_OR_DELETED(e->hashcode)) {
        UHashElement *nce = (UHashElement *)e;
        return _uhash_internalRemoveElement(hash, nce).pointer;
    }
    return NULL;
}